

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

_Bool is_relative(char *path)

{
  _Bool _Var1;
  char current_dir [260];
  char local_118 [272];
  
  if (*path != '\0') {
    get_dir(path,local_118);
    _Var1 = true;
    if ((local_118[0] != '\0') &&
       ((local_118[0] == *G_BACKSLASH_CHAR || (local_118[0] == *G_FORWARD_SLASH_CHAR)))) {
      _Var1 = false;
    }
    return _Var1;
  }
  return true;
}

Assistant:

bool is_relative(const char *path)
{
	if (strlen(path) == 0)
	{
		return true;
	}
	char drive[MAX_PATH];
	char current_dir[MAX_PATH];
	split_path(path, drive, current_dir, NULL, NULL);
#if defined(_WIN32)
	if (strlen(drive) != 0)
	{
		return false;
	}
#endif
	if (strlen(current_dir) == 0)
	{
		return true;
	}
	if ((current_dir[0] != *G_BACKSLASH_CHAR) && (current_dir[0] != *G_FORWARD_SLASH_CHAR))
	{
		return true;
	}
	return false;
}